

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifisc(bifcxdef *ctx,int argc)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  long in_RDI;
  voccxdef *voc;
  runsdef val;
  objnum cls;
  objnum obj;
  undefined8 in_stack_ffffffffffffffc8;
  int err;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  voccxdef *voc_00;
  runcxdef *in_stack_ffffffffffffffe0;
  
  voc_00 = *(voccxdef **)(*(long *)(in_RDI + 8) + 0x70);
  if (*(char *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10) == '\x05') {
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + -0x10;
    runpnil((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  }
  else {
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    err = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (*(char *)(lVar2 + -0x10) != '\x02') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),err);
    }
    uVar1 = *(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    uVar3 = (uint)uVar1;
    lVar2 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar2 + -0x10;
    if (*(char *)(lVar2 + -0x10) != '\x02') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffd0),err);
    }
    uVar4 = (uint)*(ushort *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    bifinh(voc_00,(vocidef *)(ulong)CONCAT24(uVar1,uVar4),
           (objnum)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x30));
    runpush(in_stack_ffffffffffffffe0,(dattyp)((ulong)voc_00 >> 0x20),
            (runsdef *)CONCAT44(uVar3,uVar4));
  }
  return;
}

Assistant:

void bifisc(bifcxdef *ctx, int argc)
{
    objnum    obj;
    objnum    cls;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);

    /* if checking for nil, return nil */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        rundisc(ctx->bifcxrun);
        runpnil(ctx->bifcxrun);
        return;
    }

    /* get the arguments:  object, class */
    obj = runpopobj(ctx->bifcxrun);
    cls = runpopobj(ctx->bifcxrun);

    /* return the result from bifinh() */
    runpush(ctx->bifcxrun, runclog(bifinh(voc, vocinh(voc, obj), cls)), &val);
}